

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O0

void reduce_by_index_sum<tf::DynamicPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  bool bVar2;
  byte extraout_AL;
  int iVar3;
  Executor *this;
  ResultBuilder *pRVar4;
  undefined1 *__stat_loc;
  uint in_EDI;
  double __x;
  Expression_lhs<const_int_&> EVar5;
  ResultBuilder DOCTEST_RB;
  Task ptask;
  Task stask;
  IndexRange<unsigned_long> range;
  int sol;
  int sum;
  size_t c;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  size_t n;
  int *i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> vec;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  Enum in_stack_fffffffffffffbb4;
  Executor *in_stack_fffffffffffffbb8;
  allocator_type *in_stack_fffffffffffffbc0;
  size_type in_stack_fffffffffffffbc8;
  Enum at;
  Taskflow *in_stack_fffffffffffffbd0;
  ResultBuilder *this_00;
  Executor *in_stack_fffffffffffffbf0;
  Enum in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  ExpressionDecomposer local_3fc;
  Executor *local_3f8;
  Enum local_3f0;
  int *in_stack_fffffffffffffc30;
  TestCaseData *in_stack_fffffffffffffc38;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffc98;
  char *in_stack_fffffffffffffca0;
  Executor *in_stack_fffffffffffffca8;
  __basic_future<void> local_350 [2];
  undefined8 local_330;
  vector<int,_std::allocator<int>_> *local_318;
  IndexRange<unsigned_long> *local_310;
  FlowBuilder local_308;
  Task local_300;
  undefined1 *local_2f8;
  vector<int,_std::allocator<int>_> *local_2f0;
  undefined4 *local_2e8;
  undefined1 local_2d8 [24];
  undefined4 local_2c0;
  undefined4 local_2bc;
  long local_2b8;
  int *local_2b0;
  int *local_2a8;
  int local_29c [5];
  initializer_list<int> local_288;
  initializer_list<int> *local_278;
  ResultBuilder *local_270;
  reference local_268;
  int *local_260;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_258;
  vector<int,_std::allocator<int>_> *local_250;
  vector<int,_std::allocator<int>_> local_240;
  undefined1 local_228 [232];
  undefined1 local_140 [320];
  
  this = (Executor *)(ulong)in_EDI;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),in_stack_fffffffffffffba8
            );
  tf::Executor::Executor
            (in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x180896);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffbd0);
  std::allocator<int>::allocator((allocator<int> *)0x1808b7);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::allocator<int>::~allocator((allocator<int> *)0x1808dd);
  local_250 = &local_240;
  local_258._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffba8);
  local_260 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffba8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffba8);
    if (!bVar2) break;
    local_268 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_258);
    iVar3 = rand();
    *local_268 = iVar3 % 100 + -0x32;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_258);
  }
  local_270 = (ResultBuilder *)0x1;
  do {
    this_00 = local_270;
    pRVar4 = (ResultBuilder *)std::vector<int,_std::allocator<int>_>::size(&local_240);
    if (pRVar4 <= this_00) {
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0);
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      tf::Executor::~Executor(this);
      return;
    }
    local_29c[0] = 0;
    local_29c[1] = 1;
    local_29c[2] = 3;
    local_29c[3] = 7;
    local_29c[4] = 99;
    local_288._M_array = local_29c;
    local_288._M_len = 5;
    local_278 = &local_288;
    local_2a8 = std::initializer_list<int>::begin(local_278);
    local_2b0 = std::initializer_list<int>::end
                          ((initializer_list<int> *)
                           CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    for (; local_2a8 != local_2b0; local_2a8 = local_2a8 + 1) {
      local_2b8 = (long)*local_2a8;
      at = (Enum)((ulong)local_228 >> 0x20);
      tf::Taskflow::clear((Taskflow *)0x180acb);
      local_2bc = 10;
      local_2c0 = 10;
      local_2f8 = local_2d8;
      local_2f0 = &local_240;
      local_2e8 = &local_2bc;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:423:37),_nullptr>
                ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (anon_class_24_3_10b1740b *)in_stack_fffffffffffffbf0);
      tf::Task::Task(&local_300);
      local_310 = (IndexRange<unsigned_long> *)
                  std::ref<tf::IndexRange<unsigned_long>>
                            ((IndexRange<unsigned_long> *)in_stack_fffffffffffffba8);
      local_318 = &local_240;
      tf::DynamicPartitioner<tf::DefaultClosureWrapper>::DynamicPartitioner
                ((DynamicPartitioner<tf::DefaultClosureWrapper> *)
                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (size_t)in_stack_fffffffffffffba8);
      tf::FlowBuilder::
      reduce_by_index<std::reference_wrapper<tf::IndexRange<unsigned_long>>,int,reduce_by_index_sum<tf::DynamicPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(tf::IndexRange<unsigned_long>,std::optional<int>)_1_,std::plus<int>,tf::DynamicPartitioner<tf::DefaultClosureWrapper>>
                (&local_308,local_228,local_310,&local_2c0,local_318,local_330);
      in_stack_fffffffffffffbc0 = (allocator_type *)&local_300;
      tf::Task::operator=((Task *)in_stack_fffffffffffffbc0,(Task *)&local_308);
      tf::Task::precede<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (Task *)in_stack_fffffffffffffba8);
      __stat_loc = local_140;
      tf::Executor::run(in_stack_fffffffffffffbb8,
                        (Taskflow *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      iVar3 = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
      std::__basic_future<void>::wait(local_350,__stat_loc);
      tf::Future<void>::~Future
                ((Future<void> *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      in_stack_fffffffffffffba8 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                (this_00,at,(char *)in_stack_fffffffffffffbc0,iVar3,
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),"",
                 (char *)this);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3fc,DT_REQUIRE);
      EVar5 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                         (int *)in_stack_fffffffffffffba8);
      in_stack_fffffffffffffbb8 = (Executor *)EVar5.lhs;
      in_stack_fffffffffffffbb4 = EVar5.m_at;
      in_stack_fffffffffffffbf0 = in_stack_fffffffffffffbb8;
      in_stack_fffffffffffffbf8 = in_stack_fffffffffffffbb4;
      local_3f8 = in_stack_fffffffffffffbb8;
      local_3f0 = in_stack_fffffffffffffbb4;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                ((Expression_lhs<const_int_&> *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30)
      ;
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 in_stack_fffffffffffffba8);
      doctest::detail::Result::~Result((Result *)0x180cd3);
      doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffc38,__x);
      in_stack_fffffffffffffbb0 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffbb0);
      if ((extraout_AL & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x180ddf);
    }
    local_270 = (ResultBuilder *)((long)&(local_270->super_AssertData).m_test_case + 1);
  } while( true );
}

Assistant:

void reduce_by_index_sum(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<int> vec(1000);

  for(auto& i : vec) i = ::rand() % 100 - 50;

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {
      
      taskflow.clear();

      int sum = 10;
      int sol = 10;
      tf::IndexRange<size_t> range;

      auto stask = taskflow.emplace([&](){
        range.reset(0, vec.size(), 1);
        REQUIRE(range.size() == vec.size());
        for(auto itr = vec.begin(); itr != vec.end(); itr++) {
          sum += *itr;
        }
      });

      tf::Task ptask;

      ptask = taskflow.reduce_by_index(
        std::ref(range),
        sol,
        [&](tf::IndexRange<size_t> subrange, std::optional<int> running_total){
          int lsum = running_total ? *running_total : 0;
          for(size_t i=subrange.begin(); i<subrange.end(); i+=subrange.step_size()) {
            lsum += vec[i];
          }
          return lsum;
        },
        std::plus<int>(), 
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(sol == sum);
    }
  }
}